

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodeSetPtr xmlXPathGetElementsByIds(xmlDocPtr doc,xmlChar *ids)

{
  xmlChar *ID_00;
  bool bVar1;
  xmlNodePtr local_48;
  xmlNodePtr elem;
  xmlAttrPtr attr;
  xmlChar *ID;
  xmlChar *cur;
  xmlNodeSetPtr ret;
  xmlChar *ids_local;
  xmlDocPtr doc_local;
  
  if (ids == (xmlChar *)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    doc_local = (xmlDocPtr)xmlXPathNodeSetCreate((xmlNodePtr)0x0);
    ID = ids;
    if (doc_local != (xmlDocPtr)0x0) {
      while( true ) {
        bVar1 = true;
        if ((*ID != ' ') && ((*ID < 9 || (bVar1 = true, 10 < *ID)))) {
          bVar1 = *ID == '\r';
        }
        ret = (xmlNodeSetPtr)ids;
        if (!bVar1) break;
        ID = ID + 1;
      }
      while (*ID != '\0') {
        while( true ) {
          bVar1 = false;
          if ((*ID != ' ') &&
             (((*ID < 9 || (bVar1 = false, 10 < *ID)) && (bVar1 = false, *ID != '\r')))) {
            bVar1 = *ID != '\0';
          }
          if (!bVar1) break;
          ID = ID + 1;
        }
        ID_00 = xmlStrndup((xmlChar *)ret,(int)ID - (int)ret);
        if (ID_00 != (xmlChar *)0x0) {
          local_48 = (xmlNodePtr)xmlGetID(doc,ID_00);
          if (local_48 != (xmlNodePtr)0x0) {
            if (local_48->type == XML_ATTRIBUTE_NODE) {
              local_48 = local_48->parent;
            }
            else if (local_48->type != XML_ELEMENT_NODE) {
              local_48 = (xmlNodePtr)0x0;
            }
            if (local_48 != (xmlNodePtr)0x0) {
              xmlXPathNodeSetAdd((xmlNodeSetPtr)doc_local,local_48);
            }
          }
          (*xmlFree)(ID_00);
        }
        while( true ) {
          bVar1 = true;
          if ((*ID != ' ') && ((*ID < 9 || (bVar1 = true, 10 < *ID)))) {
            bVar1 = *ID == '\r';
          }
          if (!bVar1) break;
          ID = ID + 1;
        }
        ret = (xmlNodeSetPtr)ID;
      }
    }
  }
  return (xmlNodeSetPtr)doc_local;
}

Assistant:

static xmlNodeSetPtr
xmlXPathGetElementsByIds (xmlDocPtr doc, const xmlChar *ids) {
    xmlNodeSetPtr ret;
    const xmlChar *cur = ids;
    xmlChar *ID;
    xmlAttrPtr attr;
    xmlNodePtr elem = NULL;

    if (ids == NULL) return(NULL);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);

    while (IS_BLANK_CH(*cur)) cur++;
    while (*cur != 0) {
	while ((!IS_BLANK_CH(*cur)) && (*cur != 0))
	    cur++;

        ID = xmlStrndup(ids, cur - ids);
	if (ID != NULL) {
	    /*
	     * We used to check the fact that the value passed
	     * was an NCName, but this generated much troubles for
	     * me and Aleksey Sanin, people blatantly violated that
	     * constraint, like Visa3D spec.
	     * if (xmlValidateNCName(ID, 1) == 0)
	     */
	    attr = xmlGetID(doc, ID);
	    if (attr != NULL) {
		if (attr->type == XML_ATTRIBUTE_NODE)
		    elem = attr->parent;
		else if (attr->type == XML_ELEMENT_NODE)
		    elem = (xmlNodePtr) attr;
		else
		    elem = NULL;
                /* TODO: Check memory error. */
		if (elem != NULL)
		    xmlXPathNodeSetAdd(ret, elem);
	    }
	    xmlFree(ID);
	}

	while (IS_BLANK_CH(*cur)) cur++;
	ids = cur;
    }
    return(ret);
}